

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O0

type * boost::algorithm::
       join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                 (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *Input,basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                         *Separator)

{
  bool bVar1;
  type Input_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Insert;
  type *in_RDI;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar2;
  InputIteratorT itEnd;
  InputIteratorT itBegin;
  ResultT *Result;
  _Self *in_stack_ffffffffffffff28;
  type in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  type in_stack_ffffffffffffff50;
  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_38;
  
  range_adl_barrier::begin<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff28);
  range_adl_barrier::end<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff28);
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff30._M_current,in_stack_ffffffffffffff28);
  if (bVar1) {
    in_stack_ffffffffffffff50 =
         range_adl_barrier::end<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff28);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator*(&local_38);
    detail::insert<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff48,(iterator)in_stack_ffffffffffffff50._M_current,
               in_stack_ffffffffffffff40);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)in_stack_ffffffffffffff30._M_current);
  }
  while (bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff30._M_current,
                                 in_stack_ffffffffffffff28), bVar1) {
    Input_00 = range_adl_barrier::end<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff28);
    iVar2 = as_literal<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff30._M_current);
    Insert._M_current =
         iVar2.
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
         .
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin._M_current;
    detail::
    insert<std::__cxx11::string,boost::iterator_range<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Input_00._M_current,(iterator)in_stack_ffffffffffffff50._M_current,
               (iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Insert._M_current);
    in_stack_ffffffffffffff30 =
         range_adl_barrier::end<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffff28);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator*(&local_38);
    detail::insert<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Input_00._M_current,(iterator)in_stack_ffffffffffffff50._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Insert._M_current);
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)in_stack_ffffffffffffff30._M_current);
  }
  return in_RDI;
}

Assistant:

inline typename range_value<SequenceSequenceT>::type 
        join(
            const SequenceSequenceT& Input,
            const Range1T& Separator)
        {
            // Define working types
            typedef typename range_value<SequenceSequenceT>::type ResultT;
            typedef typename range_const_iterator<SequenceSequenceT>::type InputIteratorT;

            // Parse input
            InputIteratorT itBegin=::boost::begin(Input);
            InputIteratorT itEnd=::boost::end(Input);

            // Construct container to hold the result
            ResultT Result;
            
            // Append first element
            if(itBegin!=itEnd)
            {
                detail::insert(Result, ::boost::end(Result), *itBegin);
                ++itBegin;
            }

            for(;itBegin!=itEnd; ++itBegin)
            {
                // Add separator
                detail::insert(Result, ::boost::end(Result), ::boost::as_literal(Separator));
                // Add element
                detail::insert(Result, ::boost::end(Result), *itBegin);
            }

            return Result;
        }